

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void destStore64Gray16(QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *buffer,int length)

{
  long lVar1;
  long lVar2;
  uchar *puVar3;
  quint64 qVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_short uVar8;
  long in_FS_OFFSET;
  QColorTransform tf;
  QColorSpace fromCS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = rasterBuffer->bytes_per_line;
  puVar3 = rasterBuffer->m_buffer;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < length) {
    uVar7 = (ulong)(uint)length;
  }
  do {
    if (uVar7 == uVar6) {
LAB_005bc7d3:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    qVar4 = buffer[uVar6].rgba;
    uVar8 = (unsigned_short)qVar4;
    if ((uVar8 != (unsigned_short)(qVar4 >> 0x10)) || (uVar8 != (unsigned_short)(qVar4 >> 0x20))) {
      fromCS.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QColorSpacePrivate>)&DAT_aaaaaaaaaaaaaaaa;
      bVar5 = QColorSpace::isValid(&rasterBuffer->colorSpace);
      if (bVar5) {
        QColorSpace::QColorSpace(&fromCS,&rasterBuffer->colorSpace);
      }
      else {
        QColorSpace::QColorSpace(&fromCS,SRgb);
      }
      tf.d.d.ptr = (QExplicitlySharedDataPointer<QColorTransformPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QColorSpacePrivate::transformationToXYZ((QColorSpacePrivate *)&tf);
      QColorTransformPrivate::apply<unsigned_short,QRgba64>
                ((QColorTransformPrivate *)tf.d.d.ptr,
                 (unsigned_short *)(puVar3 + (long)x * 2 + y * lVar2),buffer,(long)length,
                 (TransformFlags)0x2);
      QColorTransform::~QColorTransform(&tf);
      QColorSpace::~QColorSpace(&fromCS);
      goto LAB_005bc7d3;
    }
    *(unsigned_short *)((long)(puVar3 + (long)x * 2 + y * lVar2) + uVar6 * 2) = uVar8;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static void QT_FASTCALL destStore64Gray16(QRasterBuffer *rasterBuffer, int x, int y, const QRgba64 *buffer, int length)
{
    quint16 *data = reinterpret_cast<quint16 *>(rasterBuffer->scanLine(y)) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (buffer[k].red() != buffer[k].green() || buffer[k].red() != buffer[k].blue()) {
            failed = true;
            break;
        }
        data[k] = buffer[k].red();
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);
        tfd->apply(data, buffer, length, QColorTransformPrivate::InputPremultiplied);
    }
}